

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_AM.h
# Opt level: O1

string * __thiscall
BGIP_SolverCreator_AM<JointPolicyPureVector>::SoftPrintBrief_abi_cxx11_
          (string *__return_storage_ptr__,BGIP_SolverCreator_AM<JointPolicyPureVector> *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"BGIPSC_AltMax_nrSol",0x13);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_nrRestarts",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string SoftPrintBrief() const
        {
            std::stringstream ss;
            ss << "BGIPSC_AltMax_nrSol" << _m_nrSolutions
               << "_nrRestarts" << _m_nrRestarts;
            return(ss.str());
        }